

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunction *
GetGenericFunctionInstanceType
          (ExpressionContext *ctx,SynBase *source,TypeBase *parentType,FunctionData *function,
          ArrayView<CallArgumentData> arguments,IntrusiveList<MatchData> *aliases)

{
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  *this;
  __jmp_buf_tag *__env;
  uint uniqueId;
  MatchData *pMVar1;
  ScopeData *pSVar2;
  SynBase *pSVar3;
  SynIdentifier *name;
  MatchData *pMVar4;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  SmallArray<ArgumentData,_4U> *this_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  CallArgumentData *pCVar9;
  undefined4 extraout_var_00;
  GenericFunctionInstanceTypeResponse *pGVar10;
  SynFunctionDefinition *pSVar11;
  TypeBase *pTVar12;
  TypeBase *actualType;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SynFunctionArgument *source_00;
  IntrusiveList<MatchData> *pIVar13;
  ArgumentData *pAVar14;
  undefined4 extraout_var_03;
  TypeFunction *pTVar15;
  uint i;
  uint uVar16;
  ulong uVar17;
  ArrayView<CallArgumentData> arguments_local;
  IntrusiveList<TypeHandle> types;
  bool failed;
  MatchData *local_178;
  MatchData *pMStack_170;
  SmallArray<ArgumentData,_4U> *local_168;
  __jmp_buf_tag *local_160;
  IntrusiveList<MatchData> incomingAliases;
  IntrusiveList<TypeHandle> incomingArguments;
  GenericFunctionInstanceTypeRequest request;
  jmp_buf prevErrorHandler;
  TypeHandle *pTVar8;
  
  uVar17 = arguments._8_8_;
  arguments_local.data = arguments.data;
  arguments_local.count = arguments.count;
  if ((function->arguments).count != arguments_local.count) {
    __assert_fail("function->arguments.size() == arguments.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x188b,
                  "TypeFunction *GetGenericFunctionInstanceType(ExpressionContext &, SynBase *, TypeBase *, FunctionData *, ArrayView<CallArgumentData>, IntrusiveList<MatchData> &)"
                 );
  }
  local_168 = &function->arguments;
  incomingArguments.head = (TypeHandle *)0x0;
  incomingArguments.tail = (TypeHandle *)0x0;
  incomingAliases.head = (MatchData *)0x0;
  incomingAliases.tail = (MatchData *)0x0;
  for (uVar16 = 0; uVar16 < (uint)uVar17; uVar16 = uVar16 + 1) {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    pTVar8 = (TypeHandle *)CONCAT44(extraout_var,iVar7);
    pCVar9 = ArrayView<CallArgumentData>::operator[](&arguments_local,uVar16);
    pTVar8->type = pCVar9->type;
    pTVar8->next = (TypeHandle *)0x0;
    pTVar8->listed = false;
    IntrusiveList<TypeHandle>::push_back(&incomingArguments,pTVar8);
    uVar17 = (ulong)arguments_local.count;
  }
  pIVar13 = aliases;
  while (pMVar1 = pIVar13->head, pMVar1 != (MatchData *)0x0) {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    MatchData::MatchData((MatchData *)CONCAT44(extraout_var_00,iVar7),pMVar1->name,pMVar1->type);
    IntrusiveList<MatchData>::push_back
              (&incomingAliases,(MatchData *)CONCAT44(extraout_var_00,iVar7));
    pIVar13 = (IntrusiveList<MatchData> *)&pMVar1->next;
  }
  arguments_01.tail = incomingArguments.tail;
  arguments_01.head = incomingArguments.head;
  aliases_00.tail._0_4_ = (int)incomingAliases.tail;
  aliases_00.head = incomingAliases.head;
  aliases_00.tail._4_4_ = (int)((ulong)incomingAliases.tail >> 0x20);
  GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
            (&request,parentType,function,arguments_01,aliases_00);
  this = &ctx->genericFunctionInstanceTypeMap;
  pGVar10 = SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
            ::find(this,&request);
  if (pGVar10 == (GenericFunctionInstanceTypeResponse *)0x0) {
    pSVar2 = ctx->scope;
    pSVar3 = function->source;
    ctx->scope = function->scope;
    ctx->lookupLocation = pSVar3;
    types.head = (TypeHandle *)0x0;
    types.tail = (TypeHandle *)0x0;
    __env = ctx->errorHandler;
    memcpy(prevErrorHandler,__env,200);
    bVar6 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    uVar16 = *(uint *)(NULLC::traceContext + 0x244);
    iVar7 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar7 != 0) {
      NULLC::TraceLeaveTo(uVar16);
      ctx->scope = pSVar2;
      ctx->lookupLocation = (SynBase *)0x0;
      memcpy(__env,prevErrorHandler,200);
      ctx->errorHandlerNested = bVar6;
      longjmp((__jmp_buf_tag *)__env,1);
    }
    pSVar11 = GetGenericFunctionDefinition(ctx,source,function);
    this_00 = local_168;
    local_160 = __env;
    if (pSVar11 == (SynFunctionDefinition *)0x0) {
      if (function->importModule != (ModuleData *)0x0) {
        anon_unknown.dwarf_b837c::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      for (uVar16 = 0; uVar16 < (function->arguments).count; uVar16 = uVar16 + 1) {
        pAVar14 = SmallArray<ArgumentData,_4U>::operator[](this_00,uVar16);
        pCVar9 = ArrayView<CallArgumentData>::operator[](&arguments_local,uVar16);
        pTVar12 = MatchArgumentType(ctx,pAVar14->source,pAVar14->type,pCVar9->type,pCVar9->value,
                                    aliases);
        if ((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID == 0)) goto LAB_00167425;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar8 = (TypeHandle *)CONCAT44(extraout_var_03,iVar7);
        pTVar8->type = pTVar12;
        pTVar8->next = (TypeHandle *)0x0;
        pTVar8->listed = false;
        IntrusiveList<TypeHandle>::push_back(&types,pTVar8);
      }
    }
    else {
      bVar5 = RestoreParentTypeScope(ctx,source,parentType);
      ExpressionContext::PushTemporaryScope(ctx);
      source_00 = (pSVar11->arguments).head;
      uVar16 = 0;
      while (source_00 != (SynFunctionArgument *)0x0) {
        _failed = (TypeFunction *)((ulong)_failed & 0xffffffffffffff00);
        pTVar12 = AnalyzeType(ctx,source_00->type,true,&failed);
        if (failed != false) break;
        pCVar9 = ArrayView<CallArgumentData>::operator[](&arguments_local,uVar16);
        actualType = pCVar9->type;
        if (pTVar12 != ctx->typeAuto) {
          actualType = MatchArgumentType(ctx,&source_00->super_SynBase,pTVar12,actualType,
                                         pCVar9->value,aliases);
        }
        if ((actualType == (TypeBase *)0x0) || (actualType->typeID == 0)) break;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        name = source_00->name;
        uniqueId = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uniqueId + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_01,iVar7),ctx->allocator,
                   &source_00->super_SynBase,ctx->scope,0,actualType,name,0,uniqueId);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_01,iVar7),true);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar8 = (TypeHandle *)CONCAT44(extraout_var_02,iVar7);
        pTVar8->type = actualType;
        pTVar8->next = (TypeHandle *)0x0;
        pTVar8->listed = false;
        IntrusiveList<TypeHandle>::push_back(&types,pTVar8);
        source_00 = (SynFunctionArgument *)(source_00->super_SynBase).next;
        if ((source_00 == (SynFunctionArgument *)0x0) || ((source_00->super_SynBase).typeID != 0x36)
           ) {
          source_00 = (SynFunctionArgument *)0x0;
        }
        uVar16 = uVar16 + 1;
      }
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
      if (bVar5) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
    }
    ctx->scope = pSVar2;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(local_160,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar6;
    uVar16 = IntrusiveList<TypeHandle>::size(&types);
    if (uVar16 == arguments_local.count) {
      pIVar13 = &function->generics;
      while (pMVar1 = pIVar13->head, pIVar13 = aliases, pMVar1 != (MatchData *)0x0) {
        do {
          pMVar4 = pIVar13->head;
          if (pMVar4 == (MatchData *)0x0) goto LAB_00167425;
          bVar6 = InplaceStr::operator==(&pMVar1->name->name,&pMVar4->name->name);
          pIVar13 = (IntrusiveList<MatchData> *)&pMVar4->next;
        } while (!bVar6);
        pIVar13 = (IntrusiveList<MatchData> *)&pMVar1->next;
      }
      arguments_00.tail = types.tail;
      arguments_00.head = types.head;
      pTVar15 = ExpressionContext::GetFunctionType
                          (ctx,source,function->type->returnType,arguments_00);
      local_178 = aliases->head;
      pMStack_170 = aliases->tail;
      _failed = pTVar15;
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(this,&request,(GenericFunctionInstanceTypeResponse *)&failed);
    }
    else {
LAB_00167425:
      _failed = (TypeFunction *)0x0;
      local_178 = aliases->head;
      pMStack_170 = aliases->tail;
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(this,&request,(GenericFunctionInstanceTypeResponse *)&failed);
      pTVar15 = (TypeFunction *)0x0;
    }
  }
  else {
    pMVar1 = (pGVar10->aliases).tail;
    aliases->head = (pGVar10->aliases).head;
    aliases->tail = pMVar1;
    pTVar15 = pGVar10->functionType;
  }
  return pTVar15;
}

Assistant:

TypeFunction* GetGenericFunctionInstanceType(ExpressionContext &ctx, SynBase *source, TypeBase *parentType, FunctionData *function, ArrayView<CallArgumentData> arguments, IntrusiveList<MatchData> &aliases)
{
	assert(function->arguments.size() == arguments.size());

	// Lookup previous match for this function
	IntrusiveList<TypeHandle> incomingArguments;
	IntrusiveList<MatchData> incomingAliases;

	for(unsigned i = 0; i < arguments.size(); i++)
		incomingArguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(arguments[i].type));

	for(MatchData *curr = aliases.head; curr; curr = curr->next)
		incomingAliases.push_back(new (ctx.get<MatchData>()) MatchData(curr->name, curr->type));

	GenericFunctionInstanceTypeRequest request(parentType, function, incomingArguments, incomingAliases);

	if(GenericFunctionInstanceTypeResponse* response = ctx.genericFunctionInstanceTypeMap.find(request))
	{
		aliases = response->aliases;

		return response->functionType;
	}

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	IntrusiveList<TypeHandle> types;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
		{
			bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *argument = syntax->arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next), pos++)
			{
				bool failed = false;
				TypeBase *expectedType = AnalyzeType(ctx, argument->type, true, &failed);

				if(failed)
					break;

				CallArgumentData &actualArgument = arguments[pos];

				TypeBase *type = expectedType == ctx.typeAuto ? actualArgument.type : MatchArgumentType(ctx, argument, expectedType, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
					break;

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument, ctx.scope, 0, type, argument->name, 0, ctx.uniqueVariableId++), true);

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			ctx.PopScope(SCOPE_TEMPORARY);

			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);
		}
		else
		{
			if(function->importModule)
				Stop(ctx, source, "ERROR: imported generic function call is not supported");

			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &funtionArgument = function->arguments[i];

				CallArgumentData &actualArgument = arguments[i];

				TypeBase *type = MatchArgumentType(ctx, funtionArgument.source, funtionArgument.type, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
				{
					ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

					// TODO: what about scope restore
					return NULL;
				}

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(types.size() != arguments.size())
	{
		ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

		return NULL;
	}

	// Check that all generics have been resolved
	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		bool matched = false;

		for(MatchData *alias = aliases.head; alias; alias = alias->next)
		{
			if(curr->name->name == alias->name->name)
			{
				matched = true;
				break;
			}
		}

		if(!matched)
		{
			ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

			return NULL;
		}
	}

	TypeFunction *typeFunction = ctx.GetFunctionType(source, function->type->returnType, types);

	ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(typeFunction, aliases));

	return typeFunction;
}